

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_file_utilities.cpp
# Opt level: O0

ON_wString __thiscall
ON_FileSystemPath::CombinePaths
          (ON_FileSystemPath *this,wchar_t *left_side,bool bLeftSideContainsFileName,
          wchar_t *right_side,bool bRightSideContainsFileName,bool bAppendTrailingDirectorySeparator
          )

{
  bool bVar1;
  int iVar2;
  wchar_t *pwVar3;
  bool local_11a;
  bool local_ea;
  wchar_t *local_98;
  wchar_t *dir;
  wchar_t *vol;
  bool local_7a;
  undefined1 local_79;
  bool bPathEndsDirectorySeparator;
  ON_wString tmp;
  ON_wString local_68;
  ON_wString rhs_volume;
  ON_wString rhs;
  ON_wString rhs_fname;
  ON_wString local_40;
  ON_wString lhs;
  ON_wString lhs_fname;
  bool bAppendTrailingDirectorySeparator_local;
  bool bRightSideContainsFileName_local;
  wchar_t *right_side_local;
  bool bLeftSideContainsFileName_local;
  wchar_t *left_side_local;
  ON_wString *path;
  
  ON_wString::ON_wString(&lhs);
  if (bLeftSideContainsFileName) {
    RemoveFileName((ON_FileSystemPath *)&local_40,left_side,&lhs);
  }
  else {
    CleanPath((wchar_t *)&local_40);
  }
  ON_wString::ON_wString(&rhs);
  if (bRightSideContainsFileName) {
    RemoveFileName((ON_FileSystemPath *)&rhs_volume,right_side,&rhs);
  }
  else {
    CleanPath((wchar_t *)&rhs_volume);
  }
  ON_wString::ON_wString(&local_68);
  bVar1 = ON_wString::IsNotEmpty(&local_40);
  if (bVar1) {
    pwVar3 = ON_wString::operator_cast_to_wchar_t_(&rhs_volume);
    RemoveVolumeName((ON_FileSystemPath *)&tmp,pwVar3,&local_68);
    ON_wString::operator=(&rhs_volume,&tmp);
    ON_wString::~ON_wString(&tmp);
  }
  bVar1 = ON_wString::IsNotEmpty(&rhs_volume);
  if (bVar1) {
    pwVar3 = ON_wString::operator[](&rhs_volume,0);
    bVar1 = IsDirectorySeparator(*pwVar3,true);
    if (bVar1) {
      pwVar3 = ON_wString::operator_cast_to_wchar_t_(&rhs_volume);
      ON_wString::ON_wString((ON_wString *)&stack0xffffffffffffff88,pwVar3 + 1);
      ON_wString::operator=(&rhs_volume,(ON_wString *)&stack0xffffffffffffff88);
      ON_wString::~ON_wString((ON_wString *)&stack0xffffffffffffff88);
    }
  }
  local_79 = 0;
  ON_wString::ON_wString((ON_wString *)this,&local_40);
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  local_ea = false;
  if (bVar1) {
    iVar2 = ON_wString::Length((ON_wString *)this);
    pwVar3 = ON_wString::operator[]((ON_wString *)this,iVar2 + -1);
    local_ea = IsDirectorySeparator(*pwVar3,true);
  }
  local_7a = local_ea;
  bVar1 = ON_wString::IsNotEmpty(&rhs_volume);
  if (bVar1) {
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
    if ((bVar1) && ((local_7a & 1U) == 0)) {
      ON_wString::operator+=((ON_wString *)this,L'/');
    }
    ON_wString::operator+=((ON_wString *)this,&rhs_volume);
    bVar1 = ON_wString::IsNotEmpty(&local_40);
    if (bVar1) {
      pwVar3 = ON_wString::operator_cast_to_wchar_t_(&rhs_volume);
      bVar1 = IsRelativePath(pwVar3);
      if (bVar1) {
        ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
        CleanPath((wchar_t *)&vol);
        ON_wString::operator=((ON_wString *)this,(ON_wString *)&vol);
        ON_wString::~ON_wString((ON_wString *)&vol);
      }
    }
    bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
    local_11a = false;
    if (bVar1) {
      iVar2 = ON_wString::Length((ON_wString *)this);
      pwVar3 = ON_wString::operator[]((ON_wString *)this,iVar2 + -1);
      local_11a = IsDirectorySeparator(*pwVar3,true);
    }
    local_7a = local_11a;
  }
  bVar1 = ON_wString::IsNotEmpty((ON_wString *)this);
  lhs_fname.m_s._6_1_ = bAppendTrailingDirectorySeparator;
  if ((bVar1) && (bVar1 = ON_wString::IsNotEmpty(&rhs), bVar1)) {
    lhs_fname.m_s._6_1_ = 1;
  }
  if (((local_7a & 1U) == 0) != ((lhs_fname.m_s._6_1_ & 1) == 0)) {
    if ((lhs_fname.m_s._6_1_ & 1) == 0) {
      if ((local_7a & 1U) != 0) {
        iVar2 = ON_wString::Length((ON_wString *)this);
        ON_wString::SetLength((ON_wString *)this,(long)(iVar2 + -1));
      }
    }
    else {
      dir = (wchar_t *)0x0;
      local_98 = (wchar_t *)0x0;
      pwVar3 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)this);
      on_wsplitpath(pwVar3,&dir,&local_98,(wchar_t **)0x0,(wchar_t **)0x0);
      if (local_98 != (wchar_t *)0x0) {
        iVar2 = ON_wString::Length((ON_wString *)this);
        pwVar3 = ON_wString::operator[]((ON_wString *)this,iVar2 + -1);
        bVar1 = IsDirectorySeparator(*pwVar3,true);
        if (!bVar1) {
          ON_wString::operator+=((ON_wString *)this,L'/');
        }
      }
    }
  }
  ON_wString::operator+=((ON_wString *)this,&rhs);
  local_79 = 1;
  ON_wString::~ON_wString(&local_68);
  ON_wString::~ON_wString(&rhs_volume);
  ON_wString::~ON_wString(&rhs);
  ON_wString::~ON_wString(&local_40);
  ON_wString::~ON_wString(&lhs);
  return (ON_wString)(wchar_t *)this;
}

Assistant:

const ON_wString ON_FileSystemPath::CombinePaths(
  const wchar_t* left_side,
  bool bLeftSideContainsFileName,
  const wchar_t* right_side,
  bool bRightSideContainsFileName,
  bool bAppendTrailingDirectorySeparator
)
{
  ON_wString lhs_fname;
  ON_wString lhs
    = bLeftSideContainsFileName
    ? ON_FileSystemPath::RemoveFileName(left_side,&lhs_fname)
    : ON_FileSystemPath::CleanPath(left_side);

  ON_wString rhs_fname;
  ON_wString rhs 
    = bRightSideContainsFileName
    ? ON_FileSystemPath::RemoveFileName(right_side,&rhs_fname)
    : ON_FileSystemPath::CleanPath(right_side);

  ON_wString rhs_volume;
  if ( lhs.IsNotEmpty() )
    rhs = ON_FileSystemPath::RemoveVolumeName(rhs, &rhs_volume);

  if (rhs.IsNotEmpty() && ON_FileSystemPath::IsDirectorySeparator(rhs[0], true))
  {
    const ON_wString tmp(static_cast<const wchar_t*>(rhs) + 1);
    rhs = tmp;
  }

  ON_wString path = lhs;
  bool bPathEndsDirectorySeparator 
    = path.IsNotEmpty()
    && ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true);
  
  if (rhs.IsNotEmpty())
  {
    if (path.IsNotEmpty() && false == bPathEndsDirectorySeparator)
      path += ON_FileSystemPath::DirectorySeparator;
    path += rhs;

    if (lhs.IsNotEmpty() && ON_FileSystemPath::IsRelativePath(rhs))
      path = ON_FileSystemPath::CleanPath(path);

    bPathEndsDirectorySeparator 
      = path.IsNotEmpty()
      && ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true);
  }

  if (path.IsNotEmpty() && rhs_fname.IsNotEmpty())
    bAppendTrailingDirectorySeparator = true;

  if ((bPathEndsDirectorySeparator ? 0 : 1) != (bAppendTrailingDirectorySeparator ? 0 : 1))
  {
    if (bAppendTrailingDirectorySeparator)
    {
      const wchar_t* vol = nullptr;
      const wchar_t* dir = nullptr;
      // on_wsplitpath is called to avoid appending a directory separator to a 
      on_wsplitpath(static_cast<const wchar_t*>(path), &vol, &dir, nullptr, nullptr);
      if (nullptr != dir && false == ON_FileSystemPath::IsDirectorySeparator(path[path.Length() - 1], true))
        path += ON_FileSystemPath::DirectorySeparator;
    }
    else if ( bPathEndsDirectorySeparator )
    {
      path.SetLength(path.Length() - 1);
    }
  }

  path += rhs_fname;

  return path;
}